

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O0

expression * mathCore::varFromUUID(uint uuid)

{
  expression *this;
  undefined8 uVar1;
  expression *exp;
  uint uuid_local;
  
  this = (expression *)operator_new(0x38);
  expression::expression(this);
  this->FLAGS = 2;
  if ((uuid < expression::global_uuid) && (1 < uuid)) {
    this->uuid = uuid;
    return this;
  }
  uVar1 = __cxa_rethrow();
  operator_delete(this);
  _Unwind_Resume(uVar1);
}

Assistant:

expression* mathCore::varFromUUID(unsigned int uuid) {
	expression* exp = new expression;
	exp->FLAGS = F_VAR;

	// Bad things are happening if this happens, only valid UUIDs can be used
	if (uuid >= expression::global_uuid || uuid < 2) {
		throw;
	}
	exp->uuid = uuid;
	return exp;
}